

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_StoreGetEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  ulong uVar1;
  uint uVar2;
  Ses_TruthEntry_t *pSVar3;
  Ses_TimesEntry_t *pSVar4;
  ulong uVar5;
  ulong uVar6;
  int pTimes [8];
  int local_58 [10];
  
  uVar1 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar1 = 1;
  }
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      uVar2 = (uint)uVar5 ^
              *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar6 & 0xf) * 4) *
              (int)pTruth[uVar6];
      uVar5 = (ulong)uVar2;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    uVar5 = (ulong)(uVar2 & 0x3ff);
  }
  pSVar3 = pStore->pEntries[uVar5];
  do {
    if (pSVar3 == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
    if (((int)uVar1 < 1) || (pSVar3->nVars != nVars)) {
      if (pSVar3->nVars == nVars) {
LAB_002b9c52:
        pSVar4 = pSVar3->head;
        if (pSVar4 == (Ses_TimesEntry_t *)0x0) {
          return 0;
        }
        break;
      }
    }
    else {
      uVar5 = 0;
      while (pSVar3->pTruth[uVar5] == pTruth[uVar5]) {
        uVar5 = uVar5 + 1;
        if (uVar1 == uVar5) goto LAB_002b9c52;
      }
    }
    pSVar3 = pSVar3->next;
  } while( true );
LAB_002b9c6a:
  if (pSVar4->pNetwork == (char *)0x0) {
    if (nVars < 1) goto LAB_002b9cda;
    uVar1 = 0;
    while (pArrTimeProfile[uVar1] == pSVar4->pArrTimeProfile[uVar1]) {
      uVar1 = uVar1 + 1;
      if ((uint)nVars == uVar1) goto LAB_002b9cda;
    }
    pSVar4 = pSVar4->next;
  }
  else {
    memcpy(local_58,pArrTimeProfile,(long)nVars << 2);
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,local_58,pSVar4->pNetwork);
    if (nVars < 1) {
LAB_002b9cda:
      *pSol = pSVar4->pNetwork;
      return 1;
    }
    uVar1 = 0;
    while (local_58[uVar1] == pSVar4->pArrTimeProfile[uVar1]) {
      uVar1 = uVar1 + 1;
      if ((uint)nVars == uVar1) goto LAB_002b9cda;
    }
  }
  if (pSVar4 == (Ses_TimesEntry_t *)0x0) {
    return 0;
  }
  goto LAB_002b9c6a;
}

Assistant:

int Ses_StoreGetEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    int pTimes[8];

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        /* found after normalization wrt. to network */
        if ( pTiEntry->pNetwork )
        {
            memcpy( pTimes, pArrTimeProfile, sizeof(int) * nVars );
            Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pTimes, pTiEntry->pNetwork );

            if ( Ses_StoreTimesEqual( pTimes, pTiEntry->pArrTimeProfile, nVars ) )
                break;
        }
        /* found for non synthesized network */
        else if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}